

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

attr * findvar(char *s)

{
  iterator iVar1;
  Env *e;
  Env *this;
  _Base_ptr p_Var2;
  allocator local_39;
  key_type local_38;
  
  this = current;
  std::__cxx11::string::string((string *)&local_38,s,&local_39);
  do {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
                    *)this,&local_38);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->var_table)._M_t._M_impl.super__Rb_tree_header) {
      p_Var2 = iVar1._M_node + 2;
      goto LAB_0010973e;
    }
    this = this->pre;
  } while (this != (Env *)0x0);
  p_Var2 = (_Base_ptr)0x0;
LAB_0010973e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return (attr *)p_Var2;
}

Assistant:

struct attr *findvar(const char *s) {
    return current->findvar(s);
}